

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O1

Element * Rml::QuerySelectorMatchRecursive
                    (StyleSheetNodeListRaw *nodes,Element *element,Element *scope)

{
  __uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_> element_00;
  pointer ppSVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  _Head_base<0UL,_Rml::Element_*,_false> _Var5;
  pointer ppSVar6;
  _Head_base<0UL,_Rml::Element_*,_false> unaff_R12;
  ulong uVar7;
  bool bVar8;
  StyleSheetNodeListRaw *__range2;
  
  iVar4 = (int)((ulong)((long)(element->children).
                              super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(element->children).
                             super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
  uVar3 = iVar4 - element->num_non_dom_children;
  if (uVar3 != 0 && element->num_non_dom_children <= iVar4) {
    uVar7 = 0;
    do {
      element_00._M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
      super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl =
           (element->children).
           super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar7]._M_t.
           super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t;
      iVar4 = ::std::__cxx11::string::compare
                        ((char *)((long)element_00._M_t.
                                        super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>
                                        .super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl +
                                 0x38));
      if (iVar4 == 0) {
        bVar2 = false;
      }
      else {
        ppSVar6 = (nodes->
                  super__Vector_base<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>)
                  ._M_impl.super__Vector_impl_data._M_start;
        ppSVar1 = (nodes->
                  super__Vector_base<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>)
                  ._M_impl.super__Vector_impl_data._M_finish;
        bVar8 = ppSVar6 == ppSVar1;
        _Var5._M_head_impl = unaff_R12._M_head_impl;
        if (!bVar8) {
          bVar2 = StyleSheetNode::IsApplicable
                            (*ppSVar6,(Element *)
                                      element_00._M_t.
                                      super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>
                                      .super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,
                             scope);
          while (_Var5._M_head_impl =
                      (Element *)
                      element_00._M_t.
                      super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                      super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl, !bVar2) {
            ppSVar6 = ppSVar6 + 1;
            bVar8 = ppSVar6 == ppSVar1;
            _Var5._M_head_impl = unaff_R12._M_head_impl;
            if (bVar8) break;
            bVar2 = StyleSheetNode::IsApplicable
                              (*ppSVar6,(Element *)
                                        element_00._M_t.
                                        super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>
                                        .super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,
                               scope);
          }
        }
        bVar2 = true;
        unaff_R12._M_head_impl = _Var5._M_head_impl;
        if (bVar8) {
          _Var5._M_head_impl =
               QuerySelectorMatchRecursive
                         (nodes,(Element *)
                                element_00._M_t.
                                super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>
                                .super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,scope);
          bVar2 = _Var5._M_head_impl != (Element *)0x0;
          if (bVar2) {
            unaff_R12._M_head_impl = _Var5._M_head_impl;
          }
        }
      }
      if (bVar2) {
        return unaff_R12._M_head_impl;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar3);
  }
  return (Element *)0x0;
}

Assistant:

static Element* QuerySelectorMatchRecursive(const StyleSheetNodeListRaw& nodes, Element* element, Element* scope)
{
	const int num_children = element->GetNumChildren();

	for (int i = 0; i < num_children; i++)
	{
		Element* child = element->GetChild(i);
		if (child->GetTagName() == "#text")
			continue;

		for (const StyleSheetNode* node : nodes)
		{
			if (node->IsApplicable(child, scope))
				return child;
		}

		Element* matching_element = QuerySelectorMatchRecursive(nodes, child, scope);
		if (matching_element)
			return matching_element;
	}

	return nullptr;
}